

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushStyleVar(ImGuiStyleVar idx,float val)

{
  ImVector<ImGuiStyleMod> *this;
  ImGuiStyleMod local_2c;
  float *local_20;
  float *pvar;
  ImGuiStyleVarInfo *var_info;
  float val_local;
  ImGuiStyleVar idx_local;
  
  var_info._0_4_ = val;
  var_info._4_4_ = idx;
  pvar = (float *)GetStyleVarInfo(idx);
  if (((ImGuiStyleVarInfo *)pvar)->Type == ImGuiDataType_Float) {
    local_20 = (float *)ImGuiStyleVarInfo::GetVarPtr((ImGuiStyleVarInfo *)pvar);
    this = &GImGui->StyleModifiers;
    ImGuiStyleMod::ImGuiStyleMod(&local_2c,var_info._4_4_,*local_20);
    ImVector<ImGuiStyleMod>::push_back(this,&local_2c);
    *local_20 = var_info._0_4_;
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                ,0x1267,"void ImGui::PushStyleVar(ImGuiStyleVar, float)");
}

Assistant:

void ImGui::PushStyleVar(ImGuiStyleVar idx, float val)
{
    const ImGuiStyleVarInfo* var_info = GetStyleVarInfo(idx);
    if (var_info->Type == ImGuiDataType_Float)
    {
        float* pvar = (float*)var_info->GetVarPtr();
        GImGui->StyleModifiers.push_back(ImGuiStyleMod(idx, *pvar));
        *pvar = val;
        return;
    }
    IM_ASSERT(0); // Called function with wrong-type? Variable is not a float.
}